

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O1

void immutable::rrb_details::promote_rightmost_leaf<int,false,6>
               (ref<immutable::rrb<int,_false,_6>_> *new_rrb)

{
  uint32_t *puVar1;
  uint32_t uVar2;
  internal_node<int,_false> *piVar3;
  rrb_size_table<false> *prVar4;
  internal_node<int,_false> *piVar5;
  char *__function;
  ulong uVar6;
  long lVar7;
  rrb<int,_false,_6> *prVar8;
  ref<immutable::rrb_details::internal_node<int,_false>_> *prVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  ref<immutable::rrb_details::tree_node<int,_false>_> temp;
  ref<immutable::rrb_details::internal_node<int,_false>_> path [7];
  ref<immutable::rrb_details::internal_node<int,_false>_> local_80;
  ref<immutable::rrb<int,_false,_6>_> *local_78;
  undefined8 uStack_70;
  ref<immutable::rrb_details::internal_node<int,_false>_> local_68 [7];
  
  local_68[4].ptr = (internal_node<int,_false> *)0x0;
  local_68[5].ptr = (internal_node<int,_false> *)0x0;
  local_68[2].ptr = (internal_node<int,_false> *)0x0;
  local_68[3].ptr = (internal_node<int,_false> *)0x0;
  local_68[0].ptr = (internal_node<int,_false> *)0x0;
  local_68[1].ptr = (internal_node<int,_false> *)0x0;
  local_68[6].ptr = (internal_node<int,_false> *)0x0;
  local_78 = new_rrb;
  if (new_rrb->ptr != (rrb<int,_false,_6> *)0x0) {
    ref<immutable::rrb_details::internal_node<int,false>>::operator=
              ((ref<immutable::rrb_details::internal_node<int,false>> *)local_68,&new_rrb->ptr->root
              );
    prVar8 = local_78->ptr;
    if (prVar8 != (rrb<int,_false,_6> *)0x0) {
      uVar11 = 0;
      uVar12 = 0xfffffffa;
      do {
        prVar9 = local_68 + uVar11;
        uVar12 = uVar12 + 6;
        if (prVar8->shift <= uVar12) {
          ref<immutable::rrb_details::leaf_node<int,false>>::operator=
                    ((ref<immutable::rrb_details::leaf_node<int,false>> *)&prVar8->tail,prVar9);
          if (prVar9->ptr == (internal_node<int,_false> *)0x0) goto LAB_0014a616;
          if (local_78->ptr != (rrb<int,_false,_6> *)0x0) {
            uStack_70._4_4_ = prVar9->ptr->len;
            local_78->ptr->tail_len = uStack_70._4_4_;
            local_80.ptr = (internal_node<int,_false> *)0x0;
            ref<immutable::rrb_details::internal_node<int,_false>_>::operator=(prVar9,&local_80);
            release<int>(local_80.ptr);
            if ((int)uVar11 != 0) goto LAB_0014a2e4;
            goto LAB_0014a5ba;
          }
          break;
        }
        piVar3 = prVar9->ptr;
        if (piVar3 == (internal_node<int,_false> *)0x0) goto LAB_0014a616;
        uVar11 = (ulong)((int)uVar11 + 1);
        ref<immutable::rrb_details::internal_node<int,_false>_>::operator=
                  (local_68 + uVar11,piVar3->child + (piVar3->len - 1));
        prVar8 = local_78->ptr;
      } while (prVar8 != (rrb<int,_false,_6> *)0x0);
    }
  }
  goto LAB_0014a275;
LAB_0014a616:
  __function = 
  "T *immutable::ref<immutable::rrb_details::internal_node<int, false>>::operator->() const [T = immutable::rrb_details::internal_node<int, false>]"
  ;
  goto LAB_0014a62b;
LAB_0014a2e4:
  do {
    uVar6 = uVar11 - 1;
    if (local_68[uVar11].ptr == (internal_node<int,_false> *)0x0) {
      piVar3 = local_68[uVar6].ptr;
      if (piVar3 == (internal_node<int,_false> *)0x0) goto LAB_0014a616;
      prVar9 = local_68 + uVar6;
      if (piVar3->len == 1) {
        local_80.ptr = (internal_node<int,_false> *)0x0;
        ref<immutable::rrb_details::internal_node<int,_false>_>::operator=(prVar9,&local_80);
        release<int>(local_80.ptr);
      }
      else if ((uVar6 == 0) && (piVar3->len == 2)) {
        ref<immutable::rrb_details::internal_node<int,_false>_>::operator=(prVar9,piVar3->child);
        if (local_78->ptr == (rrb<int,_false,_6> *)0x0) goto LAB_0014a275;
        puVar1 = &local_78->ptr->shift;
        *puVar1 = *puVar1 - 6;
      }
      else {
        uVar12 = piVar3->len - 1;
        piVar5 = (internal_node<int,_false> *)malloc((ulong)uVar12 * 8 + 0x20);
        piVar5->len = uVar12;
        piVar5->type = INTERNAL_NODE;
        (piVar5->size_table).ptr = (rrb_size_table<false> *)0x0;
        ref<immutable::rrb_details::rrb_size_table<false>_>::operator=
                  (&piVar5->size_table,&piVar3->size_table);
        piVar5->child = (ref<immutable::rrb_details::internal_node<int,_false>_> *)(piVar5 + 1);
        uVar12 = piVar5->len;
        memset(piVar5 + 1,0,(ulong)uVar12 * 8);
        if ((ulong)uVar12 != 0) {
          lVar7 = 0;
          uVar11 = 0;
          do {
            ref<immutable::rrb_details::internal_node<int,_false>_>::operator=
                      ((ref<immutable::rrb_details::internal_node<int,_false>_> *)
                       ((long)&piVar5->child->ptr + lVar7),
                       (ref<immutable::rrb_details::internal_node<int,_false>_> *)
                       ((long)&piVar3->child->ptr + lVar7));
            uVar11 = uVar11 + 1;
            lVar7 = lVar7 + 8;
          } while (uVar11 < piVar5->len);
        }
        piVar5->guid = 0;
        piVar5->_ref_count = 1;
        local_80.ptr = piVar5;
        ref<immutable::rrb_details::internal_node<int,_false>_>::operator=(prVar9,&local_80);
        release<int>(local_80.ptr);
      }
    }
    else {
      piVar3 = local_68[uVar6].ptr;
      uVar12 = piVar3->len;
      piVar5 = (internal_node<int,_false> *)malloc((ulong)uVar12 * 8 + 0x20);
      piVar5->len = uVar12;
      piVar5->type = INTERNAL_NODE;
      (piVar5->size_table).ptr = (rrb_size_table<false> *)0x0;
      ref<immutable::rrb_details::rrb_size_table<false>_>::operator=
                (&piVar5->size_table,&piVar3->size_table);
      piVar5->guid = 0;
      piVar5->child = (ref<immutable::rrb_details::internal_node<int,_false>_> *)(piVar5 + 1);
      uVar12 = piVar3->len;
      memset(piVar5 + 1,0,(ulong)uVar12 * 8);
      if ((ulong)uVar12 != 0) {
        lVar7 = 0;
        uVar10 = 0;
        do {
          ref<immutable::rrb_details::internal_node<int,_false>_>::operator=
                    ((ref<immutable::rrb_details::internal_node<int,_false>_> *)
                     ((long)&piVar5->child->ptr + lVar7),
                     (ref<immutable::rrb_details::internal_node<int,_false>_> *)
                     ((long)&piVar3->child->ptr + lVar7));
          uVar10 = uVar10 + 1;
          lVar7 = lVar7 + 8;
        } while (uVar10 < piVar3->len);
      }
      prVar9 = local_68 + uVar6;
      piVar5->_ref_count = 1;
      local_80.ptr = piVar5;
      ref<immutable::rrb_details::internal_node<int,_false>_>::operator=(prVar9,&local_80);
      release<int>(local_80.ptr);
      piVar3 = prVar9->ptr;
      if (piVar3 == (internal_node<int,_false> *)0x0) goto LAB_0014a616;
      ref<immutable::rrb_details::internal_node<int,_false>_>::operator=
                (piVar3->child + (piVar3->len - 1),local_68 + uVar11);
      piVar3 = prVar9->ptr;
      if (piVar3 == (internal_node<int,_false> *)0x0) goto LAB_0014a616;
      prVar4 = (piVar3->size_table).ptr;
      if (prVar4 != (rrb_size_table<false> *)0x0) {
        uVar12 = piVar3->len;
        piVar5 = (internal_node<int,_false> *)malloc((ulong)uVar12 * 4 + 0x10);
        *(ref<immutable::rrb_details::rrb_size_table<false>_> **)piVar5 = &piVar5->size_table;
        memcpy(&piVar5->size_table,prVar4->size,(ulong)uVar12 << 2);
        piVar5->guid = 0;
        piVar5->_ref_count = 1;
        local_80.ptr = piVar5;
        ref<immutable::rrb_details::rrb_size_table<false>_>::operator=
                  (&piVar3->size_table,
                   (ref<immutable::rrb_details::rrb_size_table<false>_> *)&local_80);
        if ((local_80.ptr != (internal_node<int,_false> *)0x0) &&
           (uVar2 = (local_80.ptr)->_ref_count, (local_80.ptr)->_ref_count = uVar2 - 1, uVar2 == 1))
        {
          free(local_80.ptr);
        }
        piVar3 = prVar9->ptr;
        if (piVar3 == (internal_node<int,_false> *)0x0) goto LAB_0014a616;
        prVar4 = (piVar3->size_table).ptr;
        if (prVar4 == (rrb_size_table<false> *)0x0) {
          __function = 
          "T *immutable::ref<immutable::rrb_details::rrb_size_table<false>>::operator->() const [T = immutable::rrb_details::rrb_size_table<false>]"
          ;
          goto LAB_0014a62b;
        }
        puVar1 = prVar4->size + (piVar3->len - 1);
        *puVar1 = *puVar1 - uStack_70._4_4_;
      }
    }
    uVar11 = uVar6;
  } while (uVar6 != 0);
LAB_0014a5ba:
  prVar8 = local_78->ptr;
  if (prVar8 != (rrb<int,_false,_6> *)0x0) {
    if (local_68[0].ptr != (internal_node<int,_false> *)0x0) {
      (local_68[0].ptr)->_ref_count = (local_68[0].ptr)->_ref_count + 1;
    }
    local_80.ptr = (internal_node<int,_false> *)(prVar8->root).ptr;
    (prVar8->root).ptr = (tree_node<int,_false> *)local_68[0].ptr;
    ref<immutable::rrb_details::tree_node<int,_false>_>::~ref
              ((ref<immutable::rrb_details::tree_node<int,_false>_> *)&local_80);
    lVar7 = 0x38;
    do {
      release<int>(*(internal_node<int,_false> **)((long)&local_68[-1].ptr + lVar7));
      lVar7 = lVar7 + -8;
    } while (lVar7 != 0);
    return;
  }
LAB_0014a275:
  __function = 
  "T *immutable::ref<immutable::rrb<int, false, 6>>::operator->() const [T = immutable::rrb<int, false, 6>]"
  ;
LAB_0014a62b:
  __assert_fail("ptr != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                ,0x71a,__function);
}

Assistant:

ref<T>::ref(T* p) : ptr(p)
      {
      if (ptr)
        ptr->_ref_count = 1;
      }